

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O1

char * test_matrix4_rotatev3_xy_quarter_turn_opposite(void)

{
  int iVar1;
  vector3 *pvVar2;
  char *pcVar3;
  vector3 r;
  matrix4 m;
  vector3 vStack_a8;
  matrix4 local_90;
  
  matrix4_identity(&local_90);
  pvVar2 = vector3_get_reference_vector3(2);
  matrix4_rotatev3(&local_90,pvVar2,-1.5707963705062866);
  pvVar2 = vector3_get_reference_vector3(1);
  vector3_set(&vStack_a8,pvVar2);
  vector3_multiplym4(&vStack_a8,&local_90);
  pvVar2 = vector3_get_reference_vector3(6);
  iVar1 = vector3_equals(&vStack_a8,pvVar2);
  pcVar3 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(403) : (assertion failed) ((vector3_equals(&r, vector3_get_reference_vector3(6))))"
    ;
  }
  return pcVar3;
}

Assistant:

static char *test_matrix4_rotatev3_xy_quarter_turn_opposite(void)
{
	struct matrix4 m;
	struct vector3 r;

	matrix4_identity(&m);
	matrix4_rotatev3(&m, HYP_VECTOR3_UNIT_Y, -(HYP_TAU / 4.0f));
	vector3_set(&r, HYP_VECTOR3_UNIT_X);
	vector3_multiplym4(&r, &m);
	test_assert(vector3_equals(&r, HYP_VECTOR3_UNIT_Z_NEGATIVE));

	return NULL;
}